

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O2

wchar_t sftp_cmd_pwd(sftp_command *cmd)

{
  char *ptr;
  wchar_t wVar1;
  
  if (backend == (Backend *)0x0) {
    not_connected();
    wVar1 = L'\0';
  }
  else {
    ptr = stripctrl_string(string_scc,pwd);
    wVar1 = L'\x01';
    while (ptr != (char *)0x0) {
      printf("Remote directory is %s\n",ptr);
      safefree(ptr);
      ptr = (char *)0x0;
    }
  }
  return wVar1;
}

Assistant:

int sftp_cmd_pwd(struct sftp_command *cmd)
{
    if (!backend) {
        not_connected();
        return 0;
    }

    with_stripctrl(san, pwd)
        printf("Remote directory is %s\n", san);
    return 1;
}